

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetAllocated
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->ptr_;
  if (psVar1 == default_value || arena != (Arena *)0x0) {
    if (value != (string *)0x0) {
      this->ptr_ = value;
      if (arena == (Arena *)0x0) {
        return;
      }
      Arena::Own<std::__cxx11::string>(arena,value);
      return;
    }
  }
  else {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
    if (value != (string *)0x0) {
      this->ptr_ = value;
      return;
    }
  }
  this->ptr_ = default_value;
  return;
}

Assistant:

inline void SetAllocated(const ::std::string* default_value,
                           ::std::string* value, Arena* arena) {
    if (arena == NULL && ptr_ != default_value) {
      Destroy(default_value, arena);
    }
    if (value != NULL) {
      ptr_ = value;
      if (arena != NULL) {
        arena->Own(value);
      }
    } else {
      ptr_ = const_cast< ::std::string*>(default_value);
    }
  }